

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O2

bool_t BufferToBase64(tchar_t *Out,size_t OutLen,uint8_t *Buffer,size_t BufferSize)

{
  tchar_t tVar1;
  wchar_t wVar2;
  byte *pbVar3;
  
  pbVar3 = Buffer + 2;
  for (; (2 < BufferSize && (4 < OutLen)); OutLen = OutLen - 4) {
    tVar1 = Base64Char((uint)(pbVar3[-2] >> 2));
    *Out = tVar1;
    tVar1 = Base64Char((uint)(pbVar3[-1] >> 4) | (pbVar3[-2] & 3) << 4);
    Out[1] = tVar1;
    tVar1 = Base64Char((uint)(*pbVar3 >> 6) + (pbVar3[-1] & 0xf) * 4);
    Out[2] = tVar1;
    tVar1 = Base64Char(*pbVar3 & 0x3f);
    Out[3] = tVar1;
    BufferSize = BufferSize - 3;
    Out = Out + 4;
    pbVar3 = pbVar3 + 3;
  }
  if (BufferSize == 0) goto LAB_001090ae;
  if (OutLen < 5) {
    return 0;
  }
  tVar1 = Base64Char((uint)(pbVar3[-2] >> 2));
  *Out = tVar1;
  wVar2 = (pbVar3[-2] & 3) << 4;
  if (BufferSize == 1) {
    tVar1 = Base64Char(wVar2);
    Out[1] = tVar1;
    tVar1 = '=';
LAB_0010907f:
    Out[2] = tVar1;
    tVar1 = '=';
  }
  else {
    tVar1 = Base64Char(wVar2 | (uint)(pbVar3[-1] >> 4));
    Out[1] = tVar1;
    wVar2 = (pbVar3[-1] & 0xf) << 2;
    if (BufferSize == 2) {
      tVar1 = Base64Char(wVar2);
      goto LAB_0010907f;
    }
    tVar1 = Base64Char(wVar2 | (uint)(*pbVar3 >> 6));
    Out[2] = tVar1;
    tVar1 = Base64Char(*pbVar3 & 0x3f);
  }
  Out[3] = tVar1;
  Out = Out + 4;
LAB_001090ae:
  *Out = '\0';
  return 1;
}

Assistant:

bool_t BufferToBase64(tchar_t *Out, size_t OutLen, const uint8_t *Buffer, size_t BufferSize)
{
    while (BufferSize >= 3 && OutLen > 4) // treat packets of 3 bytes at once
    {
        Out[0] = Base64Char(Buffer[0] >> 2);
        Out[1] = Base64Char(((Buffer[0]&0x03)<<4) | (Buffer[1]>>4));
        Out[2] = Base64Char(((Buffer[1]&0x0F)<<2) | (Buffer[2]>>6));
        Out[3] = Base64Char(Buffer[2]&0x3F);
        BufferSize -= 3;
        Buffer += 3;
        OutLen -= 4;
        Out += 4;
    }

    if (BufferSize--)
    {
        if (OutLen < 5)
            return 0; // not enough room in the output buffer
        Out[0] = Base64Char(Buffer[0] >> 2);

        if (BufferSize--)
            Out[1] = Base64Char(((Buffer[0]&0x03)<<4) | (Buffer[1]>>4));
        else
            Out[1] = Base64Char((Buffer[0]&0x03)<<4);

        if (BufferSize == (size_t)-1)
            Out[2] = '=';
        else if (BufferSize--)
            Out[2] = Base64Char(((Buffer[1]&0x0F)<<2) | (Buffer[2]>>6));
        else
            Out[2] = Base64Char((Buffer[1]&0x0F)<<2);

        if (BufferSize == (size_t)-1)
            Out[3] = '=';
        else
            Out[3] = Base64Char(Buffer[2]&0x3F);
        Out += 4;
    }
    Out[0] = 0;
    return 1;
}